

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_params_util.hpp
# Opt level: O2

void __thiscall
iutest::detail::ParamTestSuiteInfo<ParamTest>::OnRegisterTests
          (ParamTestSuiteInfo<ParamTest> *this,IParamTestInfoData *infodata)

{
  pfnParamNameGeneratorFunc p_Var1;
  bool bVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  ostream *poVar5;
  undefined4 extraout_var_00;
  size_t sVar6;
  pointer generator_name;
  scoped_ptr<iutest::detail::iuIParamGenerator<int>_> p;
  allocator<char> local_251;
  IParamTestInfoData *local_250;
  ParamTestSuiteInfo<ParamTest> *local_248;
  pointer local_240;
  pointer local_238;
  TestParamInfo<int> local_230;
  string testsuite_name;
  string local_200;
  string name;
  undefined1 local_1c0 [400];
  
  local_240 = (this->m_instantiation).
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iutest::detail::ParamTestSuiteInfo<ParamTest>::Functor>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iutest::detail::ParamTestSuiteInfo<ParamTest>::Functor>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  local_250 = infodata;
  local_248 = this;
  for (generator_name =
            (this->m_instantiation).
            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iutest::detail::ParamTestSuiteInfo<ParamTest>::Functor>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iutest::detail::ParamTestSuiteInfo<ParamTest>::Functor>_>_>
            ._M_impl.super__Vector_impl_data._M_start; generator_name != local_240;
      generator_name = generator_name + 1) {
    p.m_ptr = (*(generator_name->second).CreateGen)();
    CreateTestSuiteName(&testsuite_name,local_248,&generator_name->first);
    iVar3 = (*local_250->_vptr_IParamTestInfoData[2])
                      (local_250,&testsuite_name,
                       &internal::helper::TestTypeIdHelper<ParamTest>::_dummy,0,0);
    if (p.m_ptr != (iuIParamGenerator<int> *)0x0) {
      (*(p.m_ptr)->_vptr_iuIParamGenerator[2])();
      sVar6 = 0;
      local_238 = generator_name;
      while( true ) {
        generator_name = local_238;
        iVar4 = (*(p.m_ptr)->_vptr_iuIParamGenerator[5])();
        if ((char)iVar4 != '\0') break;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_1c0,(local_250->m_name)._M_dataplus._M_p,&local_251);
        p_Var1 = (generator_name->second).ParamNameGen;
        local_230.param = (*(p.m_ptr)->_vptr_iuIParamGenerator[3])();
        local_230.index = sVar6;
        (*p_Var1)(&local_200,&local_230);
        MakeParamTestName(&name,(string *)local_1c0,&local_200);
        std::__cxx11::string::~string((string *)&local_200);
        std::__cxx11::string::~string((string *)local_1c0);
        bVar2 = CheckTestName((TestSuite *)CONCAT44(extraout_var,iVar3),&name);
        if (!bVar2) {
          IUTestLog::IUTestLog
                    ((IUTestLog *)local_1c0,LOG_WARNING,
                     "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/include/internal/iutest_params_util.hpp"
                     ,0xcb);
          poVar5 = std::operator<<((ostream *)(local_1c0 + 0x18),(string *)&testsuite_name);
          poVar5 = std::operator<<(poVar5,".");
          poVar5 = std::operator<<(poVar5,(string *)&name);
          std::operator<<(poVar5," is already exist.");
          IUTestLog::~IUTestLog((IUTestLog *)local_1c0);
        }
        iVar4 = (*local_250->_vptr_IParamTestInfoData[3])
                          (local_250,(TestSuite *)CONCAT44(extraout_var,iVar3),&name);
        local_1c0._0_4_ = (*(p.m_ptr)->_vptr_iuIParamGenerator[3])();
        (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar4) + 0x10))
                  ((long *)CONCAT44(extraout_var_00,iVar4),(IUTestLog *)local_1c0);
        sVar6 = sVar6 + 1;
        std::__cxx11::string::~string((string *)&name);
        (*(p.m_ptr)->_vptr_iuIParamGenerator[4])();
      }
    }
    std::__cxx11::string::~string((string *)&testsuite_name);
    scoped_ptr<iutest::detail::iuIParamGenerator<int>_>::~scoped_ptr(&p);
  }
  return;
}

Assistant:

virtual void OnRegisterTests(IParamTestInfoData* infodata) const IUTEST_CXX_OVERRIDE
    {
        for( typename InstantiationContainer::const_iterator gen_it=m_instantiation.begin()
            , gen_end=m_instantiation.end(); gen_it != gen_end; ++gen_it )
        {
            // パラメータ生成器の作成
            detail::scoped_ptr<ParamGenerator> p((gen_it->second.CreateGen)());

            const ::std::string testsuite_name = CreateTestSuiteName(gen_it->first);
            const char* file = gen_it->second.m_file;
            const int line = gen_it->second.m_line;
            TestSuite* testsuite = infodata->MakeTestSuite(testsuite_name
                , internal::GetTypeId<Tester>()
                , IUTEST_GET_SETUP_TESTSUITE(Tester, file, line)
                , IUTEST_GET_TEARDOWN_TESTSUITE(Tester, file, line));

            if( p.get() != NULL )
            {
                size_t i=0;
                for( p->Begin(); !p->IsEnd(); p->Next() )
                {
                    const ::std::string name = MakeParamTestName(infodata->GetName()
                        , gen_it->second.ParamNameGen(TestParamInfo<ParamType>(p->GetCurrent(), i)) );
#if IUTEST_CHECK_STRICT
                    if( !CheckTestName(testsuite, name) )
                    {
                        IUTEST_LOG_(WARNING) << testsuite_name << "." << name << " is already exist.";
                    }
#endif
                    EachTest* test = static_cast<EachTest*>(infodata->RegisterTest(testsuite, name));
                    test->SetParam(p->GetCurrent());
                    ++i;
                }
            }
        }
    }